

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O1

void help(void)

{
  printf("PuTTYgen: key generator and converter for the PuTTY tools\n%s\n","Unidentified build");
  fwrite("Usage: puttygen ( keyfile | -t type [ -b bits ] )\n                [ -C comment ] [ -P ] [ -q ]\n                [ -o output-keyfile ] [ -O type | -l | -L | -p ]\n"
         ,0xa0,1,_stdout);
  puts(
      "  -t    specify key type when generating:\n           eddsa, ecdsa, rsa, dsa, rsa1   use with -b\n           ed25519, ed448                 special cases of eddsa\n  -b    specify number of bits when generating key\n  -C    change or specify key comment\n  -P    change key passphrase\n  -q    quiet: do not display progress bar\n  -O    specify output type:\n           private             output PuTTY private key format\n           private-openssh     export OpenSSH private key\n           private-openssh-new export OpenSSH private key (force new format)\n           private-sshcom      export ssh.com private key\n           public              RFC 4716 / ssh.com public key\n           public-openssh      OpenSSH public key\n           fingerprint         output the key fingerprint\n           text                output the key components as \'name=0x####\'\n  -o    specify output file\n  -l    equivalent to `-O fingerprint\'\n  -L    equivalent to `-O public-openssh\'\n  -p    equivalent to `-O public\'\n  --dump   equivalent to `-O text\'\n  --certificate file   incorporate a certificate into the key\n  --remove-certificate remove any certificate from the key\n  --reencrypt          load a key and save it with fresh encryption\n  --old-passphrase file\n        specify file containing old key passphrase\n  --new-passphrase file\n        specify file containing new key passphrase\n  --random-device device\n        specify device to read entropy from (e.g. /dev/urandom)\n  --primes <type>      select prime-generation method:\n        probable       conventional probabilistic prime finding\n        proven         numbers that have been proven to be prime\n        proven-even    also try harder for an even distribution\n  --strong-rsa         use \"strong\" primes as RSA key factors\n  --ppk-param <key>=<value>[,<key>=<value>,...]\n        specify parameters when writing PuTTY private key file format:\n            version       PPK format version (min 2, max 3, default 3)\n            kdf           key derivation function (argon2id, argon2i, argon2d)\n            ..." /* TRUNCATED STRING LITERAL */
      );
  return;
}

Assistant:

void help(void)
{
    /*
     * Help message is an extended version of the usage message. So
     * start with that, plus a version heading.
     */
    printf("PuTTYgen: key generator and converter for the PuTTY tools\n"
           "%s\n", ver);
    usage(false);
    printf("  -t    specify key type when generating:\n"
           "           eddsa, ecdsa, rsa, dsa, rsa1   use with -b\n"
           "           ed25519, ed448                 special cases of eddsa\n"
           "  -b    specify number of bits when generating key\n"
           "  -C    change or specify key comment\n"
           "  -P    change key passphrase\n"
           "  -q    quiet: do not display progress bar\n"
           "  -O    specify output type:\n"
           "           private             output PuTTY private key format\n"
           "           private-openssh     export OpenSSH private key\n"
           "           private-openssh-new export OpenSSH private key "
                                             "(force new format)\n"
           "           private-sshcom      export ssh.com private key\n"
           "           public              RFC 4716 / ssh.com public key\n"
           "           public-openssh      OpenSSH public key\n"
           "           fingerprint         output the key fingerprint\n"
           "           text                output the key components as "
           "'name=0x####'\n"
           "  -o    specify output file\n"
           "  -l    equivalent to `-O fingerprint'\n"
           "  -L    equivalent to `-O public-openssh'\n"
           "  -p    equivalent to `-O public'\n"
           "  --dump   equivalent to `-O text'\n"
           "  --certificate file   incorporate a certificate into the key\n"
           "  --remove-certificate remove any certificate from the key\n"
           "  --reencrypt          load a key and save it with fresh "
           "encryption\n"
           "  --old-passphrase file\n"
           "        specify file containing old key passphrase\n"
           "  --new-passphrase file\n"
           "        specify file containing new key passphrase\n"
           "  --random-device device\n"
           "        specify device to read entropy from (e.g. /dev/urandom)\n"
           "  --primes <type>      select prime-generation method:\n"
           "        probable       conventional probabilistic prime finding\n"
           "        proven         numbers that have been proven to be prime\n"
           "        proven-even    also try harder for an even distribution\n"
           "  --strong-rsa         use \"strong\" primes as RSA key factors\n"
           "  --ppk-param <key>=<value>[,<key>=<value>,...]\n"
           "        specify parameters when writing PuTTY private key file "
           "format:\n"
           "            version       PPK format version (min 2, max 3, "
           "default 3)\n"
           "            kdf           key derivation function (argon2id, "
           "argon2i, argon2d)\n"
           "            memory        Kbyte of memory to use in passphrase "
           "hash\n"
           "                             (default 8192)\n"
           "            time          approx milliseconds to hash for "
           "(default 100)\n"
           "            passes        number of hash passes to run "
           "(alternative to 'time')\n"
           "            parallelism   number of parallelisable threads in the "
           "hash function\n"
           "                             (default 1)\n"
           );
}